

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.cpp
# Opt level: O2

void __thiscall
duckdb::roaring::RunContainerScanState::ScanPartial
          (RunContainerScanState *this,Vector *result,idx_t result_offset,idx_t to_scan)

{
  idx_t *piVar1;
  idx_t iVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  idx_t amount;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  
  FlatVector::VerifyFlatVector(result);
  if (this->run_index == 0) {
    (*(this->super_ContainerScanState)._vptr_ContainerScanState[5])(this);
  }
  uVar8 = 0;
  while ((uVar8 < to_scan && (this->finished == false))) {
    uVar3 = (ulong)(this->run).start;
    iVar2 = (this->super_ContainerScanState).scanned_count;
    uVar4 = iVar2 + to_scan;
    uVar9 = uVar4;
    if (uVar3 < uVar4) {
      uVar9 = uVar3;
    }
    uVar6 = uVar8 + iVar2;
    if (uVar8 + iVar2 < uVar9) {
      uVar6 = uVar9;
    }
    lVar5 = uVar6 - iVar2;
    uVar9 = uVar3 + (this->run).length + 1;
    if (uVar9 < uVar4) {
      uVar4 = uVar9;
    }
    lVar7 = uVar4 - uVar6;
    if (uVar6 <= uVar4 && lVar7 != 0) {
      iVar2 = result_offset + lVar5;
      SetInvalidRange(&result->validity,iVar2,iVar2 + lVar7);
      iVar2 = (this->super_ContainerScanState).scanned_count;
    }
    uVar8 = lVar7 + lVar5;
    if (iVar2 + uVar8 == uVar9) {
      (*(this->super_ContainerScanState)._vptr_ContainerScanState[5])(this);
    }
  }
  piVar1 = &(this->super_ContainerScanState).scanned_count;
  *piVar1 = *piVar1 + to_scan;
  return;
}

Assistant:

void RunContainerScanState::ScanPartial(Vector &result, idx_t result_offset, idx_t to_scan) {
	auto &result_mask = FlatVector::Validity(result);

	// This method assumes that the validity mask starts off as having all bits set for the entries that are being
	// scanned.

	idx_t result_idx = 0;
	if (!run_index) {
		LoadNextRun();
	}
	while (!finished && result_idx < to_scan) {
		// Either we are already inside a run, then 'start_of_run' will be scanned_count
		// or we're skipping values until the run begins
		auto start_of_run =
		    MaxValue<idx_t>(MinValue<idx_t>(run.start, scanned_count + to_scan), scanned_count + result_idx);
		result_idx = start_of_run - scanned_count;

		// How much of the run are we covering?
		idx_t run_end = run.start + 1 + run.length;
		auto run_or_scan_end = MinValue<idx_t>(run_end, scanned_count + to_scan);

		// Process the run
		D_ASSERT(run_or_scan_end >= start_of_run);
		if (run_or_scan_end > start_of_run) {
			idx_t amount = run_or_scan_end - start_of_run;
			idx_t start = result_offset + result_idx;
			idx_t end = start + amount;
			SetInvalidRange(result_mask, start, end);
		}

		result_idx += run_or_scan_end - start_of_run;
		if (scanned_count + result_idx == run_end) {
			// Fully processed the current run
			LoadNextRun();
		}
	}
	scanned_count += to_scan;
}